

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

ssize_t __thiscall CVmStringSource::read(CVmStringSource *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined4 in_register_00000034;
  
  bVar1 = this->pos + (long)__buf <= this->memlen;
  if (bVar1) {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),this->mem + this->pos,(size_t)__buf);
    this->pos = (long)__buf + this->pos;
  }
  return (ulong)!bVar1;
}

Assistant:

virtual int read(void *buf, size_t len)
    {
        /* make sure there's enough data to satisfy the request */
        if (pos + (long)len > memlen)
            return 1;

        /* copy the data */
        memcpy(buf, mem + pos, len);

        /* advance the read pointer */
        pos += len;

        /* success */
        return 0;
    }